

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

int cmp_flatrange_addr(void *addr_,void *fr_)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  AddrRange *addr;
  long lVar7;
  
  uVar1 = *addr_;
  lVar2 = *(long *)((long)addr_ + 8);
  lVar7 = *(long *)((long)addr_ + 0x18) + lVar2 +
          (ulong)CARRY8(*(ulong *)((long)addr_ + 0x10),uVar1);
  uVar3 = *(ulong *)((long)fr_ + 0x10);
  lVar4 = *(long *)((long)fr_ + 0x18);
  uVar5 = (ulong)(uVar3 < *(ulong *)((long)addr_ + 0x10) + uVar1);
  lVar6 = lVar4 - lVar7;
  if ((SBORROW8(lVar4,lVar7) != SBORROW8(lVar6,uVar5)) != (long)(lVar6 - uVar5) < 0) {
    lVar6 = lVar4 + *(long *)((long)fr_ + 0x28) + (ulong)CARRY8(uVar3,*(ulong *)((long)fr_ + 0x20));
    uVar1 = (ulong)(uVar1 < uVar3 + *(ulong *)((long)fr_ + 0x20));
    lVar4 = lVar2 - lVar6;
    return (int)((SBORROW8(lVar2,lVar6) != SBORROW8(lVar4,uVar1)) == (long)(lVar4 - uVar1) < 0);
  }
  return -1;
}

Assistant:

static int cmp_flatrange_addr(const void *addr_, const void *fr_)
{
    const AddrRange *addr = addr_;
    const FlatRange *fr = fr_;

    if (int128_le(addrrange_end(*addr), fr->addr.start)) {
        return -1;
    } else if (int128_ge(addr->start, addrrange_end(fr->addr))) {
        return 1;
    }
    return 0;
}